

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void decode_reconstruct_tx
               (AV1_COMMON *cm,ThreadData *td,aom_reader *r,MB_MODE_INFO *mbmi,int plane,
               BLOCK_SIZE plane_bsize,int blk_row,int blk_col,int block,TX_SIZE tx_size,
               int *eob_total)

{
  byte tx_size_00;
  TX_SIZE TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int col;
  int iVar6;
  int iVar7;
  
  if (plane == 0) {
    TVar1 = mbmi->inter_tx_size
            [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[plane_bsize] & 0x1f)) +
             ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[plane_bsize] & 0x1f)) <<
             (av1_get_txb_size_index_stride_log2_table[plane_bsize] & 0x1f))];
  }
  else {
    TVar1 = av1_get_max_uv_txsize
                      (mbmi->bsize,(td->dcb).xd.plane[plane].subsampling_x,
                       (td->dcb).xd.plane[plane].subsampling_y);
  }
  iVar2 = max_block_high((MACROBLOCKD *)td,plane_bsize,plane);
  iVar3 = max_block_wide((MACROBLOCKD *)td,plane_bsize,plane);
  iVar7 = iVar2 - blk_row;
  iVar4 = iVar3 - blk_col;
  if ((iVar4 != 0 && blk_col <= iVar3) && (iVar7 != 0 && blk_row <= iVar2)) {
    if ((plane != 0) || (TVar1 == tx_size)) {
      (*td->read_coeffs_tx_inter_block_visit)(cm,&td->dcb,r,plane,blk_row,blk_col,tx_size);
      (*td->inverse_tx_inter_block_visit)(cm,&td->dcb,r,plane,blk_row,blk_col,tx_size);
      *eob_total = *eob_total + (uint)(td->dcb).eob_data[plane][(td->dcb).txb_offset[plane]].eob;
      set_cb_buffer_offsets(&td->dcb,tx_size,plane);
      return;
    }
    tx_size_00 = ""[tx_size];
    iVar2 = tx_size_wide_unit[tx_size_00];
    iVar3 = tx_size_high_unit[tx_size_00];
    if (tx_size_high_unit[tx_size] < iVar7) {
      iVar7 = tx_size_high_unit[tx_size];
    }
    if (tx_size_wide_unit[tx_size] < iVar4) {
      iVar4 = tx_size_wide_unit[tx_size];
    }
    for (iVar5 = 0; iVar5 < iVar7; iVar5 = iVar5 + iVar3) {
      for (iVar6 = 0; iVar6 < iVar4; iVar6 = iVar6 + iVar2) {
        decode_reconstruct_tx
                  (cm,td,r,mbmi,0,plane_bsize,blk_row + iVar5,blk_col + iVar6,block,tx_size_00,
                   eob_total);
        block = block + iVar3 * iVar2;
      }
    }
  }
  return;
}

Assistant:

static inline void decode_reconstruct_tx(AV1_COMMON *cm, ThreadData *const td,
                                         aom_reader *r,
                                         MB_MODE_INFO *const mbmi, int plane,
                                         BLOCK_SIZE plane_bsize, int blk_row,
                                         int blk_col, int block,
                                         TX_SIZE tx_size, int *eob_total) {
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];
  // Scale to match transform block unit.
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (tx_size == plane_tx_size || plane) {
    td->read_coeffs_tx_inter_block_visit(cm, dcb, r, plane, blk_row, blk_col,
                                         tx_size);

    td->inverse_tx_inter_block_visit(cm, dcb, r, plane, blk_row, blk_col,
                                     tx_size);
    eob_info *eob_data = dcb->eob_data[plane] + dcb->txb_offset[plane];
    *eob_total += eob_data->eob;
    set_cb_buffer_offsets(dcb, tx_size, plane);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    assert(IMPLIES(tx_size <= TX_4X4, sub_txs == tx_size));
    assert(IMPLIES(tx_size > TX_4X4, sub_txs < tx_size));
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int sub_step = bsw * bsh;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);

    assert(bsw > 0 && bsh > 0);

    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;

        decode_reconstruct_tx(cm, td, r, mbmi, plane, plane_bsize, offsetr,
                              offsetc, block, sub_txs, eob_total);
        block += sub_step;
      }
    }
  }
}